

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> __thiscall
node::anon_unknown_2::MinerImpl::createNewBlock
          (MinerImpl *this,CScript *script_pub_key,BlockCreateOptions *options)

{
  ArgsManager **ppAVar1;
  ChainstateManager *this_00;
  Chainstate *chainstate;
  long lVar2;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  Options assemble_options;
  BlockAssembler local_130;
  Options local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.super_BlockCreateOptions.coinbase_output_max_additional_sigops = in_RCX[2];
  local_68.super_BlockCreateOptions._0_8_ = *in_RCX;
  local_68.super_BlockCreateOptions.coinbase_max_additional_weight = in_RCX[1];
  local_68.nBlockMaxWeight = 0x3cf960;
  local_68.blockMinFeeRate.nSatoshisPerK = 1000;
  local_68.test_block_validity = true;
  local_68.print_modified_fee = false;
  ppAVar1 = inline_assertion_check<true,ArgsManager*&>
                      ((ArgsManager **)
                       (*(long *)((long)&(script_pub_key->super_CScriptBase)._union + 8) + 0x60),
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x393,"createNewBlock","m_node.args");
  ApplyArgsManOptions(*ppAVar1,&local_68);
  this_00 = chainman((MinerImpl *)script_pub_key);
  chainstate = ChainstateManager::ActiveChainstate(this_00);
  lVar2 = (**(code **)((script_pub_key->super_CScriptBase)._union.indirect_contents.indirect + 0x48)
          )(script_pub_key);
  BlockAssembler::BlockAssembler(&local_130,chainstate,*(CTxMemPool **)(lVar2 + 0x30),&local_68);
  BlockAssembler::CreateNewBlock((BlockAssembler *)this,(CScript *)&local_130);
  BlockAssembler::~BlockAssembler(&local_130);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
            )(__uniq_ptr_data<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CBlockTemplate> createNewBlock(const CScript& script_pub_key, const BlockCreateOptions& options) override
    {
        BlockAssembler::Options assemble_options{options};
        ApplyArgsManOptions(*Assert(m_node.args), assemble_options);
        return BlockAssembler{chainman().ActiveChainstate(), context()->mempool.get(), assemble_options}.CreateNewBlock(script_pub_key);
    }